

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_true,_false>::rebuild_
          (DaTrie<true,_true,_false> *this,DaTrie<true,_true,_false> *rhs_trie)

{
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks;
  byte bVar1;
  uint uVar2;
  pointer pBVar3;
  pointer pBVar4;
  bool bVar5;
  uint32_t uVar6;
  char *str;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  np_stack;
  Edge edge;
  pair<unsigned_int,_unsigned_int> local_170;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_168;
  ulong local_148;
  size_t local_140;
  Edge local_138;
  
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar3 != pBVar4) {
    local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::reserve((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&local_168,
              (ulong)((int)((ulong)((long)pBVar4 - (long)pBVar3) >> 3) - this->bc_emps_));
    local_138.labels_._0_8_ = (char *)0x0;
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<std::pair<unsigned_int,unsigned_int>>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&local_168,(pair<unsigned_int,_unsigned_int> *)&local_138);
    blocks = &rhs_trie->blocks_;
    fix_(rhs_trie,0,blocks);
    pBVar3 = (rhs_trie->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pBVar3 = (Bc)((ulong)*pBVar3 | 0x7fffffff00000000);
    while (local_168._M_impl.super__Vector_impl_data._M_start !=
           local_168._M_impl.super__Vector_impl_data._M_finish) {
      uVar7 = local_168._M_impl.super__Vector_impl_data._M_finish[-1].first;
      uVar8 = (ulong)uVar7;
      uVar2 = local_168._M_impl.super__Vector_impl_data._M_finish[-1].second;
      (rhs_trie->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar2] =
           (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar8];
      if (((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].field_0x3 & 0x80) == 0) {
        local_168._M_impl.super__Vector_impl_data._M_finish =
             local_168._M_impl.super__Vector_impl_data._M_finish + -1;
        memset(&local_138,0,0x108);
        local_148 = uVar8;
        edge_(this,uVar7,&local_138,0x100);
        uVar6 = xcheck_(rhs_trie,&local_138,blocks);
        pBVar3 = (rhs_trie->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar3[uVar2] =
             (Bc)((ulong)(uVar6 & 0x7fffffff) | (ulong)pBVar3[uVar2] & 0xffffffff00000000);
        local_140 = local_138.size_;
        for (sVar9 = 0; local_140 != sVar9; sVar9 = sVar9 + 1) {
          bVar1 = local_138.labels_[sVar9];
          uVar7 = uVar6 ^ bVar1;
          fix_(rhs_trie,uVar7,blocks);
          pBVar3 = (rhs_trie->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar3[uVar7] =
               (Bc)((ulong)pBVar3[uVar7] & 0x80000000ffffffff | (ulong)(uVar2 & 0x7fffffff) << 0x20)
          ;
          local_170.first =
               *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                         super__Vector_impl_data._M_start + local_148) & 0x7fffffff ^ (uint)bVar1;
          local_170.second = uVar7;
          std::
          vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
          ::emplace_back<std::pair<unsigned_int,unsigned_int>>
                    ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                      *)&local_168,&local_170);
        }
      }
      else {
        local_168._M_impl.super__Vector_impl_data._M_finish =
             local_168._M_impl.super__Vector_impl_data._M_finish + -1;
        bVar5 = is_terminal_(this,uVar7);
        if (bVar5) {
          pBVar3 = (rhs_trie->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar3[uVar2] =
               (Bc)((ulong)pBVar3[uVar2] & 0xffffffff00000000 |
                    (ulong)*(uint *)((this->bc_).
                                     super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                                     super__Vector_impl_data._M_start + uVar8) | 0x80000000);
        }
        else {
          str = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start +
                (SUB84((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8],0) & 0x7fffffff);
          local_138.labels_[8] = '\0';
          local_138.labels_[9] = '\0';
          local_138.labels_[10] = '\0';
          local_138.labels_[0xb] = '\0';
          local_138.labels_[0xc] = 0xff;
          local_138.labels_[0xd] = 0xff;
          local_138.labels_[0xe] = 0xff;
          local_138.labels_[0xf] = '\x7f';
          local_138.labels_[0x10] = '\0';
          local_138.labels_[0x11] = '\0';
          local_138.labels_[0x12] = '\0';
          local_138.labels_[0x13] = '\0';
          local_138.labels_[0x14] = '\0';
          local_138.labels_._0_8_ = str;
          uVar6 = utils::length(str);
          local_138.labels_._12_4_ = *(undefined4 *)(str + uVar6);
          local_138.labels_._16_4_ = uVar2;
          insert_tail_(rhs_trie,(Query *)&local_138);
        }
      }
    }
    std::
    _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~_Vector_base(&local_168);
  }
  return;
}

Assistant:

void rebuild_(DaTrie& rhs_trie) const {
    assert(rhs_trie.is_empty());

    if (is_empty()) {
      return;
    }

    using NodePair = std::pair<uint32_t, uint32_t>;

    std::vector<NodePair> np_stack;
    np_stack.reserve(num_nodes());
    np_stack.push_back({ROOT_POS, ROOT_POS});

    rhs_trie.fix_(ROOT_POS, rhs_trie.blocks_);
    rhs_trie.bc_[ROOT_POS].set_check(INVALID_VALUE);

    while (!np_stack.empty()) {
      const NodePair node_pair = np_stack.back();
      np_stack.pop_back();

      if (WithNLM) {
        rhs_trie.node_links_[node_pair.second] = node_links_[node_pair.first];
      }

      if (bc_[node_pair.first].is_leaf()) {
        if (is_terminal_(node_pair.first)) {
          rhs_trie.bc_[node_pair.second].set_value(bc_[node_pair.first].value());
        } else {
          auto tail = tail_.data() + bc_[node_pair.first].value();
          Query query(tail);
          query.set_value(utils::extract_value(tail + utils::length(tail)));
          query.set_node_pos(node_pair.second);
          rhs_trie.insert_tail_(query);
        }
        continue;
      }

      Edge edge;
      edge_(node_pair.first, edge);

      auto rhs_base = rhs_trie.xcheck_(edge, rhs_trie.blocks_);
      rhs_trie.bc_[node_pair.second].set_base(rhs_base);

      for (auto label : edge) {
        auto rhs_child_pos = rhs_base ^label;
        rhs_trie.fix_(rhs_child_pos, rhs_trie.blocks_);
        rhs_trie.bc_[rhs_child_pos].set_check(node_pair.second);
        np_stack.push_back({bc_[node_pair.first].base() ^ label, rhs_child_pos});
      }
    }
  }